

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O3

bool __thiscall
Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>::CheckProtoChainInternal
          (PrototypeChainCache<Js::OnlyWritablePropertyCache> *this,RecyclableObject *prototype)

{
  Type *this_00;
  ScriptContext *pSVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  Type TVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  
  if (prototype == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0xc0,"(prototype)","prototype");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  this_00 = (prototype->type).ptr;
  TVar6 = this_00->typeId;
  if (TVar6 != TypeIds_Null) {
    pSVar1 = (((this_00->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    bVar4 = true;
    pTVar8 = this_00;
    do {
      if (TVar6 == TypeIds_Proxy) {
        return false;
      }
      pSVar2 = (((pTVar8->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      bVar5 = RecyclableObject::HasOnlyWritableDataProperties(prototype);
      if (!bVar5) {
        return false;
      }
      bVar4 = (bool)(bVar4 & pSVar2 == pSVar1);
      prototype = RecyclableObject::GetPrototype(prototype);
      pTVar8 = (prototype->type).ptr;
      TVar6 = pTVar8->typeId;
    } while (TVar6 != TypeIds_Null);
    if (!bVar4) {
      return true;
    }
  }
  Js::Type::SetAreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties(this_00,true);
  return true;
}

Assistant:

bool
PrototypeChainCache<T>::CheckProtoChainInternal(RecyclableObject* prototype)
{
    Assert(prototype);

    Type *const originalType = prototype->GetType();
    ScriptContext *const scriptContext = prototype->GetScriptContext();

    bool onlyOneScriptContext = true;
    TypeId typeId;
    for (; (typeId = prototype->GetTypeId()) != TypeIds_Null; prototype = prototype->GetPrototype())
    {
        if (typeId == TypeIds_Proxy)
        {
            return false;
        }
        if (prototype->GetScriptContext() != scriptContext)
        {
            onlyOneScriptContext = false;
        }
        if (!T::CheckObject(prototype))
        {
            return false;
        }
    }

    if (onlyOneScriptContext)
    {
        // Technically, we could register all prototypes in the chain but this is good enough for now
        T::Cache(originalType);
    }

    return true;
}